

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

parser_error parse_prefs_monster_base(parser *p)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *pcVar3;
  monster_base *pmVar4;
  long lVar5;
  angband_constants *paVar6;
  ulong uVar7;
  monster_race *pmVar8;
  parser_error pVar9;
  
  pcVar3 = (char *)parser_priv(p);
  if (pcVar3 != (char *)0x0) {
    pVar9 = PARSE_ERROR_NONE;
    if (*pcVar3 == '\0') {
      pcVar3 = parser_getsym(p,"name");
      pmVar4 = lookup_monster_base(pcVar3);
      if (pmVar4 == (monster_base *)0x0) {
        pVar9 = PARSE_ERROR_NO_KIND_FOUND;
      }
      else {
        wVar1 = parser_getint(p,"attr");
        wVar2 = parser_getint(p,"char");
        pVar9 = PARSE_ERROR_NONE;
        if (z_info->r_max != 0) {
          lVar5 = 8;
          uVar7 = 0;
          paVar6 = z_info;
          pmVar8 = r_info;
          do {
            if (*(monster_base **)(pmVar8->flags + lVar5 + -0x3c) == pmVar4) {
              monster_x_attr[*(uint *)(pmVar8->flags + lVar5 + -0x5c)] = (uint8_t)wVar1;
              monster_x_char[*(uint *)(pmVar8->flags + lVar5 + -0x5c)] = wVar2;
              paVar6 = z_info;
              pmVar8 = r_info;
            }
            uVar7 = uVar7 + 1;
            lVar5 = lVar5 + 0xd0;
          } while (uVar7 < paVar6->r_max);
          pVar9 = PARSE_ERROR_NONE;
        }
      }
    }
    return pVar9;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x2c6,"enum parser_error parse_prefs_monster_base(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_monster_base(struct parser *p)
{
	const char *name;
	struct monster_base *mb;
	size_t i;
	uint8_t a;
	wchar_t c;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	mb = lookup_monster_base(name);
	if (!mb)
		return PARSE_ERROR_NO_KIND_FOUND;
	a = (uint8_t)parser_getint(p, "attr");
	c = (wchar_t)parser_getint(p, "char");

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		if (race->base != mb) continue;

		monster_x_attr[race->ridx] = a;
		monster_x_char[race->ridx] = c;
	}

	return PARSE_ERROR_NONE;
}